

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixVariablePS::execute
          (FixVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  bool bVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  VarStatus *pVVar4;
  int __c;
  int __c_00;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_R9;
  byte in_stack_00000010;
  int k_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  int k;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  VarStatus VVar5;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  uint uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffba0;
  undefined1 local_41c [80];
  undefined1 local_3cc [80];
  undefined1 local_37c [60];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcc0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcc8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcd0;
  undefined1 local_2dc [80];
  undefined1 local_28c [80];
  undefined1 local_23c [80];
  uint local_1ec;
  undefined1 local_1e8 [80];
  undefined1 local_198 [80];
  uint local_148;
  byte local_141;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_140;
  long *local_110;
  undefined1 *local_108;
  long *local_100;
  undefined1 *local_f8;
  long *local_f0;
  undefined1 *local_e8;
  long *local_e0;
  undefined1 *local_d8;
  long *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  long *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_141 = in_stack_00000010 & 1;
  local_140 = in_R9;
  if ((*(byte *)(in_RDI + 0x2e) & 1) != 0) {
    pnVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          in_stack_fffffffffffffb7c);
    local_88 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            in_stack_fffffffffffffb7c);
    local_90 = pnVar3;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    pnVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          in_stack_fffffffffffffb7c);
    local_98 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            in_stack_fffffffffffffb7c);
    local_a0 = pnVar3;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_140,(int)in_RDI[5]);
    VVar5 = *pVVar4;
    pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_140,*(int *)((long)in_RDI + 0x2c));
    *pVVar4 = VVar5;
  }
  local_a8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          in_stack_fffffffffffffb7c);
  local_b0 = in_RDI + 6;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  for (local_148 = 0; uVar6 = local_148,
      iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x30)), (int)uVar6 < iVar2; local_148 = local_148 + 1) {
    in_stack_fffffffffffffba0 =
         SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(in_RDI + 0x30),local_148);
    local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            in_stack_fffffffffffffb7c);
    local_28 = local_198;
    local_30 = in_stack_fffffffffffffba0;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,in_stack_fffffffffffffba0,local_38);
    local_20 = local_198;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    local_8 = local_198;
    local_10 = local_30;
    local_18 = local_38;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (cpp_dec_float<100U,_int,_void> *)0x59505c);
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(in_RDI + 0x30),(char *)(ulong)local_148,__c);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb7c);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_fffffffffffffba0,
                 (self_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  }
  local_110 = in_RDI + 0x10;
  local_108 = local_1e8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  local_1ec = 0;
  while (uVar6 = local_1ec,
        iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(in_RDI + 0x30)), (int)uVar6 < iVar2) {
    pnVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x30),local_1ec);
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(in_RDI + 0x30),(char *)(ulong)local_1ec,__c_00);
    local_78 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            in_stack_fffffffffffffb7c);
    local_68 = local_23c;
    local_70 = pnVar3;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_79,pnVar3,local_78);
    local_60 = local_23c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    local_48 = local_23c;
    local_50 = local_70;
    local_58 = local_78;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (cpp_dec_float<100U,_int,_void> *)0x59522a);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator-=(in_stack_fffffffffffffba0,(self_type *)CONCAT44(uVar6,in_stack_fffffffffffffb98));
    local_1ec = local_1ec + 1;
  }
  local_b8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          in_stack_fffffffffffffb7c);
  local_c0 = local_1e8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  bVar1 = boost::multiprecision::operator==
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x5952b2);
  if (bVar1) {
    pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_140,(int)in_RDI[5]);
    *pVVar4 = FIXED;
  }
  else {
    local_100 = in_RDI + 6;
    local_f8 = local_28c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    local_f0 = in_RDI + 0x1a;
    local_e8 = local_2dc;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    (**(code **)(*in_RDI + 0x38))(&stack0xfffffffffffffcd4);
    bVar1 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0
                      );
    if (bVar1) {
      VVar5 = ON_LOWER;
    }
    else {
      local_e0 = in_RDI + 6;
      local_d8 = local_37c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      local_d0 = in_RDI + 0x24;
      local_c8 = local_3cc;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      (**(code **)(*in_RDI + 0x38))(local_41c);
      bVar1 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                         in_stack_fffffffffffffcc0);
      VVar5 = ZERO;
      if (bVar1) {
        VVar5 = ON_UPPER;
      }
    }
    pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_140,(int)in_RDI[5]);
    *pVVar4 = VVar5;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FixVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // update the index mapping; if m_correctIdx is false, we assume that this has happened already
   if(m_correctIdx)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   x[m_j] = m_val;

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] += m_col.value(k) * x[m_j];

   // dual:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
      val -= m_col.value(k) * y[m_col.index(k)];

   r[m_j] = val;

   // basis:
   if(m_lower == m_upper)
   {
      assert(EQrel(m_lower, m_val, this->epsilon()));

      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else
   {
      assert(EQrel(m_val, m_lower, this->epsilon()) || EQrel(m_val, m_upper, this->epsilon())
             || m_val == 0.0);

      cStatus[m_j] = EQrel(m_val, m_lower, this->epsilon()) ? SPxSolverBase<R>::ON_LOWER : (EQrel(m_val,
                     m_upper, this->epsilon()) ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ZERO);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_correctIdx)
   {
      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM19 Dimension doesn't match after this step.");
      }
   }

#endif
}